

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_cls_s16_aarch64(uint32_t arg)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = do_clz16((ushort)((uint)(int)(short)(ushort)arg >> 0xf) ^ (ushort)arg);
  uVar1 = (ushort)(arg >> 0x10);
  iVar3 = do_clz16((short)uVar1 >> 0xf ^ uVar1);
  return (iVar3 * 0x10000 + (iVar2 - 1U & 0xffff)) - 0x10000;
}

Assistant:

uint32_t HELPER(neon_cls_s32)(uint32_t x)
{
    int count;
    if ((int32_t)x < 0)
        x = ~x;
    for (count = 32; x; count--)
        x = x >> 1;
    return count - 1;
}